

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

StackVersion
ts_parser__reduce(TSParser *self,StackVersion version,TSSymbol symbol,uint32_t count,
                 int dynamic_precedence,uint16_t alias_sequence_id,_Bool fragile)

{
  int32_t *piVar1;
  SubtreePool *pool;
  byte bVar2;
  uint uVar3;
  TSLanguage *self_00;
  int iVar4;
  StackSliceArray SVar5;
  uint32_t uVar6;
  Subtree *pSVar7;
  int iVar8;
  StackVersion SVar9;
  _Bool _Var10;
  TSStateId state;
  MutableSubtree left;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint32_t uVar15;
  ushort state_00;
  uint32_t uVar16;
  uint uVar17;
  StackVersion version1;
  int iVar18;
  uint uVar19;
  MutableSubtree MVar20;
  SubtreeHeapData *pSVar21;
  StackSlice *pSVar22;
  StackSlice *pSVar23;
  uint uVar24;
  int iVar25;
  bool bVar26;
  byte bVar27;
  StackSliceArray SVar28;
  TableEntry entry;
  StackSlice slice;
  ulong local_e0;
  TableEntry local_b8;
  undefined8 local_a8;
  StackSlice *local_a0;
  SubtreeArray local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_70;
  StackVersion local_64;
  uint local_60;
  int local_5c;
  SubtreeArray local_58;
  ulong local_40;
  StackSlice *local_38;
  
  bVar27 = 0;
  uVar3 = (self->stack->heads).size;
  local_5c = dynamic_precedence;
  SVar28 = ts_stack_pop_count(self->stack,version,count);
  uVar16 = SVar28.size;
  if (uVar16 != 0) {
    pool = &self->tree_pool;
    local_60 = (uint)alias_sequence_id;
    local_38 = SVar28.contents + 1;
    local_40 = (ulong)(2 - uVar16);
    iVar18 = 0;
    local_e0 = 0;
    local_64 = version;
    SVar5 = SVar28;
    do {
      local_78 = SVar5._8_8_;
      local_a0 = SVar5.contents;
      pSVar22 = SVar28.contents;
      iVar14 = (int)local_e0;
      local_88 = *(undefined8 *)&pSVar22[local_e0].version;
      pSVar23 = pSVar22 + local_e0;
      local_98.contents = (pSVar23->subtrees).contents;
      local_98.size = (pSVar23->subtrees).size;
      local_98.capacity = (pSVar23->subtrees).capacity;
      uVar24 = (int)local_88 - iVar18;
      uVar17 = SVar28.size;
      if ((iVar14 == 0) || (uVar24 < 0xb)) {
        uVar12 = local_98._8_8_ & 0xffffffff;
        local_58.size = 0;
        if (uVar12 != 0) {
          do {
            uVar11 = uVar12 - 1;
            pSVar21 = local_98.contents[uVar11 & 0xffffffff].ptr;
            if (((ulong)pSVar21 & 1) == 0) {
              uVar19 = *(uint *)&pSVar21->field_0x2c >> 2;
            }
            else {
              uVar19 = (uint)((ulong)pSVar21 >> 3) & 0x1fffffff;
            }
            if ((uVar19 & 1) == 0) {
              local_58.size = (uint32_t)uVar12;
              break;
            }
            uVar12 = uVar11;
          } while ((int)uVar11 != 0);
        }
        local_58.capacity = local_98.capacity;
        local_70 = local_88;
        local_58.contents = local_98.contents;
        left = ts_subtree_new_node(pool,symbol,&local_58,local_60,self->language);
        if (iVar14 + 1U < uVar17) {
          uVar12 = (ulong)(iVar14 + 1U);
          do {
            uVar11 = uVar12;
            local_a8 = *(undefined8 *)&pSVar22[uVar11].version;
            pSVar23 = pSVar22 + uVar11;
            local_b8.actions = (TSParseAction *)(pSVar23->subtrees).contents;
            local_b8.action_count = (pSVar23->subtrees).size;
            local_b8._12_4_ = (pSVar23->subtrees).capacity;
            if ((int)local_a8 != (int)local_88) break;
            uVar12 = local_b8._8_8_ & 0xffffffff;
            uVar15 = local_b8.action_count + 1;
            do {
              bVar26 = uVar12 == 0;
              uVar12 = uVar12 - 1;
              if (bVar26) {
                uVar15 = 0;
                break;
              }
              pSVar21 = ((Subtree *)local_b8.actions)[uVar12].ptr;
              if (((ulong)pSVar21 & 1) == 0) {
                uVar19 = *(uint *)&pSVar21->field_0x2c >> 2;
              }
              else {
                uVar19 = (uint)((ulong)pSVar21 >> 3) & 0x1fffffff;
              }
              uVar15 = uVar15 - 1;
            } while ((uVar19 & 1) != 0);
            MVar20 = left;
            pSVar21 = (self->scratch_tree).ptr;
            for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
              uVar6 = ((Length *)((long)MVar20 + 4))->bytes;
              pSVar21->ref_count = *(uint32_t *)MVar20;
              (pSVar21->padding).bytes = uVar6;
              MVar20.data = MVar20.data + (ulong)bVar27 * -0x10 + 8;
              pSVar21 = (SubtreeHeapData *)((long)pSVar21 + (ulong)bVar27 * -0x10 + 8);
            }
            ((self->scratch_tree).ptr)->child_count = 0;
            ts_subtree_set_children
                      (self->scratch_tree,(Subtree *)local_b8.actions,uVar15,self->language);
            _Var10 = ts_parser__select_tree(self,(Subtree)left,*(Subtree *)&self->scratch_tree);
            if (_Var10) {
              pSVar21 = (self->scratch_tree).ptr;
              MVar20 = left;
              for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
                uVar15 = (pSVar21->padding).bytes;
                *(uint32_t *)MVar20 = pSVar21->ref_count;
                ((Length *)((long)MVar20 + 4))->bytes = uVar15;
                pSVar21 = (SubtreeHeapData *)((long)pSVar21 + (ulong)bVar27 * -0x10 + 8);
                MVar20.data = MVar20.data + (ulong)bVar27 * -0x10 + 8;
              }
              ts_subtree_array_delete(pool,&local_98);
              local_88 = local_a8;
              local_98.contents = (Subtree *)local_b8.actions;
              local_98._8_8_ = local_b8._8_8_;
            }
            else {
              ts_subtree_array_delete(pool,(SubtreeArray *)&local_b8);
            }
            uVar12 = uVar11 + 1;
            local_e0 = uVar11;
          } while ((uint)(uVar11 + 1) != uVar17);
        }
        piVar1 = &((left.ptr)->field_17).field_0.dynamic_precedence;
        *piVar1 = *piVar1 + local_5c;
        ((left.ptr)->field_17).field_0.alias_sequence_id = alias_sequence_id;
        if ((self->stack->heads).size <= uVar24) {
          __assert_fail("(uint32_t)version < (&self->heads)->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
        }
        state_00 = ((self->stack->heads).contents[uVar24].node)->state;
        if (symbol < 0xfffe) {
          self_00 = self->language;
          if ((uint)symbol < self_00->token_count) {
            ts_language_table_entry(self_00,state_00,symbol,&local_b8);
            if (local_b8.action_count != 0) {
              state = *(TSStateId *)(local_b8.actions + (local_b8.action_count - 1));
              bVar2 = *(byte *)((long)local_b8.actions + (ulong)(local_b8.action_count - 1) * 8 + 6)
              ;
              if (((bVar2 & 0xf) == 0) || ((bVar2 & 0xf) == 3)) goto LAB_001378af;
            }
            goto LAB_0013785c;
          }
          state = self_00->parse_table[(uint)state_00 * self_00->symbol_count + (uint)symbol];
        }
        else {
LAB_0013785c:
          state = 0;
        }
LAB_001378af:
        if (1 < uVar3 || (uVar16 != 1 || fragile)) {
          (left.ptr)->field_0x2c = (left.ptr)->field_0x2c | 0x18;
          state_00 = TS_TREE_STATE_NONE;
        }
        (left.ptr)->parse_state = state_00;
        ts_stack_push(self->stack,uVar24,(Subtree)left,false,state);
        pSVar7 = local_98.contents;
        uVar17 = (left.ptr)->child_count;
        if (uVar17 < local_98.size) {
          iVar14 = local_98.size - uVar17;
          lVar13 = 0;
          do {
            ts_stack_push(self->stack,uVar24,pSVar7[(ulong)uVar17 + lVar13],false,state);
            lVar13 = lVar13 + 1;
          } while (iVar14 != (int)lVar13);
        }
        SVar9 = local_64;
        pSVar23 = local_a0;
        if ((int)local_70 != iVar18) {
          version1 = 0;
          do {
            if ((SVar9 != version1) &&
               (_Var10 = ts_stack_merge(self->stack,version1,uVar24), _Var10)) {
              iVar18 = iVar18 + 1;
              break;
            }
            version1 = version1 + 1;
          } while (uVar24 != version1);
        }
        SVar28.size = (undefined4)local_78;
        SVar28.capacity = local_78._4_4_;
        SVar28.contents = pSVar23;
        iVar14 = (int)local_e0;
      }
      else {
        ts_stack_remove_version(self->stack,uVar24);
        ts_subtree_array_delete(pool,&local_98);
        iVar18 = iVar18 + 1;
        uVar24 = iVar14 + 1;
        if (uVar24 < uVar17) {
          iVar8 = (int)local_88;
          local_a8 = *(undefined8 *)&pSVar22[uVar24].version;
          pSVar22 = pSVar22 + uVar24;
          local_b8.actions = (TSParseAction *)(pSVar22->subtrees).contents;
          local_b8.action_count = (pSVar22->subtrees).size;
          local_b8._12_4_ = (pSVar22->subtrees).capacity;
          if ((int)local_a8 == (int)local_88) {
            local_70 = CONCAT44(local_70._4_4_,uVar24);
            pSVar23 = local_38 + uVar24;
            iVar4 = (int)local_40;
            iVar25 = 0;
            do {
              ts_subtree_array_delete(pool,(SubtreeArray *)&local_b8);
              if (iVar4 + iVar14 == iVar25) {
                iVar14 = (int)local_70 - iVar25;
                goto LAB_00137977;
              }
              local_a8 = *(undefined8 *)&pSVar23->version;
              local_b8.actions = (TSParseAction *)(pSVar23->subtrees).contents;
              local_b8.action_count = (pSVar23->subtrees).size;
              local_b8._12_4_ = (pSVar23->subtrees).capacity;
              iVar25 = iVar25 + -1;
              pSVar23 = pSVar23 + 1;
            } while ((int)local_a8 == iVar8);
            iVar14 = iVar14 - iVar25;
LAB_00137977:
            SVar28.size = (undefined4)local_78;
            SVar28.capacity = local_78._4_4_;
            SVar28.contents = local_a0;
          }
        }
      }
      SVar5.size = (undefined4)local_78;
      SVar5.capacity = local_78._4_4_;
      SVar5.contents = local_a0;
      local_e0 = (ulong)(iVar14 + 1U);
    } while (iVar14 + 1U < SVar28.size);
  }
  uVar17 = 0xffffffff;
  if (uVar3 < (self->stack->heads).size) {
    uVar17 = uVar3;
  }
  return uVar17;
}

Assistant:

static StackVersion ts_parser__reduce(TSParser *self, StackVersion version, TSSymbol symbol,
                                      uint32_t count, int dynamic_precedence,
                                      uint16_t alias_sequence_id, bool fragile) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);
  uint32_t removed_version_count = 0;
  StackSliceArray pop = ts_stack_pop_count(self->stack, version, count);

  for (uint32_t i = 0; i < pop.size; i++) {
    StackSlice slice = pop.contents[i];
    StackVersion slice_version = slice.version - removed_version_count;

    // Error recovery can sometimes cause lots of stack versions to merge,
    // such that a single pop operation can produce a lots of slices.
    // Avoid creating too many stack versions in that situation.
    if (i > 0 && slice_version > MAX_VERSION_COUNT + MAX_VERSION_COUNT_OVERFLOW) {
      ts_stack_remove_version(self->stack, slice_version);
      ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
      removed_version_count++;
      while (i + 1 < pop.size) {
        StackSlice next_slice = pop.contents[i + 1];
        if (next_slice.version != slice.version) break;
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
        i++;
      }
      continue;
    }

    // Extra tokens on top of the stack should not be included in this new parent
    // node. They will be re-pushed onto the stack after the parent node is
    // created and pushed.
    SubtreeArray children = slice.subtrees;
    while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
      children.size--;
    }

    MutableSubtree parent = ts_subtree_new_node(&self->tree_pool,
      symbol, &children, alias_sequence_id, self->language
    );

    // This pop operation may have caused multiple stack versions to collapse
    // into one, because they all diverged from a common state. In that case,
    // choose one of the arrays of trees to be the parent node's children, and
    // delete the rest of the tree arrays.
    while (i + 1 < pop.size) {
      StackSlice next_slice = pop.contents[i + 1];
      if (next_slice.version != slice.version) break;
      i++;

      SubtreeArray children = next_slice.subtrees;
      while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
        children.size--;
      }

      if (ts_parser__replace_children(self, &parent, &children)) {
        ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
        slice = next_slice;
      } else {
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
      }
    }

    parent.ptr->dynamic_precedence += dynamic_precedence;
    parent.ptr->alias_sequence_id = alias_sequence_id;

    TSStateId state = ts_stack_state(self->stack, slice_version);
    TSStateId next_state = ts_language_next_state(self->language, state, symbol);
    if (fragile || pop.size > 1 || initial_version_count > 1) {
      parent.ptr->fragile_left = true;
      parent.ptr->fragile_right = true;
      parent.ptr->parse_state = TS_TREE_STATE_NONE;
    } else {
      parent.ptr->parse_state = state;
    }

    // Push the parent node onto the stack, along with any extra tokens that
    // were previously on top of the stack.
    ts_stack_push(self->stack, slice_version, ts_subtree_from_mut(parent), false, next_state);
    for (uint32_t j = parent.ptr->child_count; j < slice.subtrees.size; j++) {
      ts_stack_push(self->stack, slice_version, slice.subtrees.contents[j], false, next_state);
    }

    for (StackVersion j = 0; j < slice_version; j++) {
      if (j == version) continue;
      if (ts_stack_merge(self->stack, j, slice_version)) {
        removed_version_count++;
        break;
      }
    }
  }

  // Return the first new stack version that was created.
  return ts_stack_version_count(self->stack) > initial_version_count
    ? initial_version_count
    : STACK_VERSION_NONE;
}